

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O1

void message_loop(string *filename,string *download_address,curl_off_t file_length,
                 download_status *status)

{
  list<Task_*,_std::allocator<Task_*>_> *plVar1;
  size_t *psVar2;
  Task *this;
  pointer pcVar3;
  _Map_pointer pppVar4;
  curl_off_t cVar5;
  long lVar6;
  _List_node_base *p_Var7;
  undefined8 extraout_RAX;
  iterator task_i;
  iterator unaff_R12;
  bool bVar8;
  proxy current_proxy;
  Task *local_c0;
  value_type local_98;
  _List_node_base *local_68;
  proxy local_60;
  
  plVar1 = &status->globalTaskList;
  local_68 = (_List_node_base *)&status->globalProxyList;
  do {
    if ((status->taskMessageQueue).c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        (status->taskMessageQueue).c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      pthread_mutex_lock((pthread_mutex_t *)&tpListLock);
      pthread_mutex_lock((pthread_mutex_t *)&messageLock);
      this = *(status->taskMessageQueue).c.super__Deque_base<Task_*,_std::allocator<Task_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
      std::deque<Task_*,_std::allocator<Task_*>_>::pop_front
                ((deque<Task_*,_std::allocator<Task_*>_> *)status);
      pthread_mutex_unlock((pthread_mutex_t *)&messageLock);
      p_Var7 = local_68;
      if (this->status == 3) {
        std::__cxx11::list<proxy,_std::allocator<proxy>_>::remove
                  ((list<proxy,_std::allocator<proxy>_> *)local_68,(char *)&this->proxy_server);
        if ((((_List_base<proxy,_std::allocator<proxy>_> *)&p_Var7->_M_next)->_M_impl)._M_node.
            super__List_node_base._M_next == p_Var7) {
          message_loop();
          if ((_List_node_base *)local_60.address._M_dataplus._M_p != unaff_R12._M_node) {
            operator_delete(local_60.address._M_dataplus._M_p,
                            local_60.address.field_2._M_allocated_capacity + 1);
          }
          operator_delete(local_c0,0x68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98.address._M_dataplus._M_p != &local_98.address.field_2) {
            operator_delete(local_98.address._M_dataplus._M_p,
                            local_98.address.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(extraout_RAX);
        }
        for (task_i._M_node =
                  (plVar1->super__List_base<Task_*,_std::allocator<Task_*>_>)._M_impl._M_node.
                  super__List_node_base._M_next;
            (task_i._M_node != (_List_node_base *)plVar1 &&
            ((Task *)task_i._M_node[1]._M_next != this)); task_i._M_node = (task_i._M_node)->_M_next
            ) {
        }
        cover_or_trim_task(task_i,filename,download_address,status);
      }
      else {
        local_98.address._M_dataplus._M_p = (pointer)&local_98.address.field_2;
        pcVar3 = (this->proxy_server).address._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar3,pcVar3 + (this->proxy_server).address._M_string_length
                  );
        local_98.index = (this->proxy_server).index;
        local_98._36_4_ = *(undefined4 *)&(this->proxy_server).field_0x24;
        local_98.speed = (this->proxy_server).speed;
        cVar5 = Task::length(this);
        unaff_R12._M_node = (_List_node_base *)plVar1;
        if (0x300000 < cVar5) {
          local_98.speed = this->speed;
        }
        do {
          cVar5 = local_98.speed;
          unaff_R12._M_node = (unaff_R12._M_node)->_M_next;
          if (unaff_R12._M_node == (_List_node_base *)plVar1) {
            if ((long)(status->globalTaskList).super__List_base<Task_*,_std::allocator<Task_*>_>.
                      _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[4]._M_next <
                file_length) {
              local_c0 = (Task *)operator_new(0x68);
              unaff_R12._M_node = (_List_node_base *)&local_60.address.field_2;
              pcVar3 = (this->proxy_server).address._M_dataplus._M_p;
              local_60.address._M_dataplus._M_p = (pointer)unaff_R12._M_node;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,pcVar3,
                         pcVar3 + (this->proxy_server).address._M_string_length);
              local_60.index = (this->proxy_server).index;
              local_60._36_4_ = *(undefined4 *)&(this->proxy_server).field_0x24;
              local_60.speed = (this->proxy_server).speed;
              Task::Task(local_c0,&local_60,
                         (curl_off_t)
                         (status->globalTaskList).super__List_base<Task_*,_std::allocator<Task_*>_>.
                         _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[4]._M_next,0);
              if ((_List_node_base *)local_60.address._M_dataplus._M_p != unaff_R12._M_node) {
                operator_delete(local_60.address._M_dataplus._M_p,
                                local_60.address.field_2._M_allocated_capacity + 1);
              }
              lVar6 = cVar5 * 0x14 +
                      (long)(status->globalTaskList).
                            super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
                            super__List_node_base._M_prev[1]._M_next[4]._M_next;
              if (file_length <= lVar6) {
                lVar6 = file_length;
              }
              local_c0->end = lVar6;
              p_Var7 = (_List_node_base *)operator_new(0x18);
              p_Var7[1]._M_next = (_List_node_base *)local_c0;
              std::__detail::_List_node_base::_M_hook(p_Var7);
              psVar2 = &(status->globalTaskList).super__List_base<Task_*,_std::allocator<Task_*>_>.
                        _M_impl._M_node._M_size;
              *psVar2 = *psVar2 + 1;
              bVar8 = true;
              Task::execute(local_c0,filename,download_address,&status->taskMessageQueue);
            }
            else {
              std::deque<proxy,_std::allocator<proxy>_>::push_back
                        (&(status->pending_proxy_servers).c,&local_98);
              pppVar4 = (status->pending_proxy_servers).c.
                        super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node;
              bVar8 = ((long)(status->pending_proxy_servers).c.
                             super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
                             super__Deque_impl_data._M_start._M_last -
                       (long)(status->pending_proxy_servers).c.
                             super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
                      ((long)(status->pending_proxy_servers).c.
                             super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_cur -
                       (long)(status->pending_proxy_servers).c.
                             super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
                      (((long)pppVar4 -
                        (long)(status->pending_proxy_servers).c.
                              super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                      (ulong)(pppVar4 == (_Map_pointer)0x0)) * 10 !=
                      (status->globalProxyList).super__List_base<proxy,_std::allocator<proxy>_>.
                      _M_impl._M_node._M_size;
            }
            goto LAB_00104071;
          }
        } while (*(short *)&unaff_R12._M_node[1]._M_next[5]._M_next != 3);
        std::deque<proxy,_std::allocator<proxy>_>::push_back
                  (&(status->pending_proxy_servers).c,&local_98);
        bVar8 = true;
        cover_or_trim_task(unaff_R12,filename,download_address,status);
LAB_00104071:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.address._M_dataplus._M_p != &local_98.address.field_2) {
          operator_delete(local_98.address._M_dataplus._M_p,
                          local_98.address.field_2._M_allocated_capacity + 1);
        }
        if (!bVar8) {
          return;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tpListLock);
    }
    usleep(20000);
  } while( true );
}

Assistant:

void
message_loop(const string &filename, const string &download_address, curl_off_t file_length, download_status *status) {
    while (true) {
        if (!status->taskMessageQueue.empty()) {
            // 直接加锁了，不废话。
            pthread_mutex_lock(&tpListLock);
            pthread_mutex_lock(&messageLock);
            Task *task_reported = status->taskMessageQueue.front();
            status->taskMessageQueue.pop();
            pthread_mutex_unlock(&messageLock);
            if (task_reported->status == STATUS_ERROR) {
                // 下载出错，删去有问题的代理服务器，并尝试从空闲的代理中拿到新的来下载这块数据。
                status->globalProxyList.remove(task_reported->proxy_server);
                if (status->globalProxyList.empty()) {
                    fputs("no proxy to use.", stderr);
                    exit(-1);
                }
                cover_or_trim_task(find(status->globalTaskList.begin(), status->globalTaskList.end(), task_reported),
                                   filename, download_address, status);
                goto loop_end;
            } else {
                // 不是错误，就是成功了。下载成功，就重新查询列表中是否有失败的下载，如果有则要“切开”分配下载任务，在此之前，我们需要确定这个成功的代理服务器的下载速度。
                proxy current_proxy = task_reported->proxy_server;

                // 只有足够大的下载才算有效速度。
                if (task_reported->length() > MINI_DOWNLOAD_BYTES) {
                    current_proxy.speed = task_reported->speed;
                }
                // 声明当前代理闲置，切开有错误的下载或对其重新分配。
                for (auto new_task = status->globalTaskList.begin();
                     new_task != status->globalTaskList.end(); new_task++) {
                    if ((*new_task)->status == STATUS_ERROR) {
                        status->pending_proxy_servers.push(current_proxy);
                        cover_or_trim_task(new_task, filename, download_address, status);
                        goto loop_end;
                    }
                }
                // 遍历了所有任务，也找不到下载错误的任务，就分配新的任务让这个空出来的服务器下载。
                curl_off_t new_block_length = current_proxy.speed * EXPECT_DOWNLOAD_TIME_SEC;
                if (status->globalTaskList.back()->end < file_length) {
                    Task *task_to_append = new Task(task_reported->proxy_server, status->globalTaskList.back()->end, 0);
                    // 全局下载任务还没有分配到尽头，需要继续往下分配。
                    if (status->globalTaskList.back()->end + new_block_length < file_length) {
                        task_to_append->end = status->globalTaskList.back()->end + new_block_length;
                    } else {
                        // 整个下载在这个任务分配完毕后已经走到了尽头。
                        task_to_append->end = file_length;
                    }
                    status->globalTaskList.push_back(task_to_append);
                    task_to_append->execute(filename, download_address, &status->taskMessageQueue);
                    goto loop_end;
                } else {
                    // 找不到新块，就把代理服务器和下载速度放在待命区域，准备下载。
                    status->pending_proxy_servers.push(current_proxy);
                    if (status->pending_proxy_servers.size() == status->globalProxyList.size()) {
                        // 所有的服务器都已经空出来了，可以完成下载了。
                        return;
                    }
                    goto loop_end;
                }
            }
            loop_end:;
            pthread_mutex_unlock(&tpListLock);
        }
        usleep(20000);
    }
}